

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HMAC_SHA2_256.c
# Opt level: O0

void Hacl_Impl_SHA2_256_update_last(uint32_t *state,uint8_t *data,uint32_t len)

{
  uint32_t *b;
  uint8_t *data_00;
  __uint64_t i;
  uint in_EDX;
  void *in_RSI;
  long in_RDI;
  uint64_t encodedlen;
  uint8_t *buf2;
  uint8_t *buf1;
  uint32_t pad0len;
  uint8_t *padding;
  uint32_t n1;
  uint8_t *final_blocks;
  uint32_t nb;
  uint8_t blocks [128];
  uint32_t *state_00;
  undefined1 *local_a8;
  undefined1 local_98 [64];
  undefined1 auStack_58 [68];
  uint local_14;
  void *local_10;
  long local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_98,0,0x80);
  if (local_14 < 0x38) {
    local_a8 = auStack_58;
  }
  else {
    local_a8 = local_98;
  }
  memcpy(local_a8,local_10,(ulong)local_14);
  b = (uint32_t *)(local_a8 + local_14 + (ulong)(0x40 - (local_14 + 9 & 0x3f) & 0x3f) + 1);
  data_00 = (uint8_t *)(((ulong)*(uint *)(local_8 + 0x220) * 0x40 + (ulong)local_14) * 8);
  local_a8[local_14] = 0x80;
  state_00 = b;
  i = __bswap_64((__uint64_t)data_00);
  store64((uint8_t *)b,i);
  Hacl_Impl_SHA2_256_update_multi(state_00,data_00,(uint32_t)((ulong)b >> 0x20));
  return;
}

Assistant:

static void Hacl_Impl_SHA2_256_update_last(uint32_t *state, uint8_t *data, uint32_t len)
{
  uint8_t blocks[128U] = { 0U };
  uint32_t nb;
  if (len < (uint32_t)56U)
    nb = (uint32_t)1U;
  else
    nb = (uint32_t)2U;
  uint8_t *final_blocks;
  if (len < (uint32_t)56U)
    final_blocks = blocks + (uint32_t)64U;
  else
    final_blocks = blocks;
  memcpy(final_blocks, data, len * sizeof data[0U]);
  uint32_t n1 = state[136U];
  uint8_t *padding = final_blocks + len;
  uint32_t
  pad0len = ((uint32_t)64U - (len + (uint32_t)8U + (uint32_t)1U) % (uint32_t)64U) % (uint32_t)64U;
  uint8_t *buf1 = padding;
  uint8_t *buf2 = padding + (uint32_t)1U + pad0len;
  uint64_t
  encodedlen = ((uint64_t)n1 * (uint64_t)(uint32_t)64U + (uint64_t)len) * (uint64_t)(uint32_t)8U;
  buf1[0U] = (uint8_t)0x80U;
  store64_be(buf2, encodedlen);
  Hacl_Impl_SHA2_256_update_multi(state, final_blocks, nb);
}